

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O0

int Ivy_ManCheckFanoutNums(Ivy_Man_t *p)

{
  int iVar1;
  Ivy_Obj_t *pObj_00;
  uint local_20;
  int local_1c;
  int Counter;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if ((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pObj_00), iVar1 != 0)) {
      iVar1 = Ivy_ObjRefs(pObj_00);
      local_20 = (iVar1 == 0) + local_20;
    }
  }
  if (local_20 != 0) {
    printf("Sequential AIG has %d dangling nodes.\n",(ulong)local_20);
  }
  return local_20;
}

Assistant:

int Ivy_ManCheckFanoutNums( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, Counter = 0;
    Ivy_ManForEachObj( p, pObj, i )
        if ( Ivy_ObjIsNode(pObj) )
            Counter += (Ivy_ObjRefs(pObj) == 0);
    if ( Counter )
        printf( "Sequential AIG has %d dangling nodes.\n", Counter );
    return Counter;
}